

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_key_share.cc
# Opt level: O0

bool bssl::ssl_name_to_group_id(uint16_t *out_group_id,char *name,size_t len)

{
  int iVar1;
  size_t sVar2;
  NamedGroup *group;
  NamedGroup *__end1;
  NamedGroup *__begin1;
  NamedGroup (*__range1) [7];
  size_t len_local;
  char *name_local;
  uint16_t *out_group_id_local;
  
  __end1 = (NamedGroup *)&(anonymous_namespace)::kNamedGroups;
  while( true ) {
    if (__end1 == (NamedGroup *)"N4bssl12_GLOBAL__N_110ECKeyShareE") {
      return false;
    }
    sVar2 = strlen(__end1->name);
    if ((len == sVar2) && (iVar1 = strncmp(__end1->name,name,len), iVar1 == 0)) break;
    sVar2 = strlen(__end1->alias);
    if (((sVar2 != 0) && (sVar2 = strlen(__end1->alias), len == sVar2)) &&
       (iVar1 = strncmp(__end1->alias,name,len), iVar1 == 0)) {
      *out_group_id = __end1->group_id;
      return true;
    }
    __end1 = __end1 + 1;
  }
  *out_group_id = __end1->group_id;
  return true;
}

Assistant:

bool ssl_name_to_group_id(uint16_t *out_group_id, const char *name,
                          size_t len) {
  for (const auto &group : kNamedGroups) {
    if (len == strlen(group.name) &&  //
        !strncmp(group.name, name, len)) {
      *out_group_id = group.group_id;
      return true;
    }
    if (strlen(group.alias) > 0 && len == strlen(group.alias) &&
        !strncmp(group.alias, name, len)) {
      *out_group_id = group.group_id;
      return true;
    }
  }
  return false;
}